

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

void nh_stream_copy(nh_stream_t *stream,char *src,uint32_t size)

{
  uint uVar1;
  char *pcVar2;
  
  uVar1 = stream->length + size;
  if (stream->capacity < uVar1) {
    stream->capacity = uVar1;
    pcVar2 = (char *)realloc(stream->buf,(ulong)uVar1);
    stream->buf = pcVar2;
    if (pcVar2 == (char *)0x0) {
      __assert_fail("stream->buf != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/unbyte[P]naive-httpserver/lib/server.c"
                    ,0x168,"void nh_stream_copy(nh_stream_t *, const char *, uint32_t)");
    }
  }
  memcpy(stream->buf + stream->length,src,(ulong)size);
  stream->length = stream->length + size;
  return;
}

Assistant:

void nh_stream_copy(nh_stream_t *stream, char const src[static 1], uint32_t size) {
    if (stream->length + size > stream->capacity) {
        stream->capacity = stream->length + size;
        stream->buf = (char *) realloc(stream->buf, stream->capacity);
        assert(stream->buf != NULL);
    }
    memcpy(stream->buf + stream->length, src, size);
    stream->length += size;
}